

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O3

void start_pass_phuff_decoder(j_decompress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  jpeg_entropy_decoder *pjVar4;
  jpeg_error_mgr *pjVar5;
  int (*paiVar6) [64];
  bool bVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  code *pcVar11;
  int iVar12;
  code *pcVar13;
  int (*paiVar14) [64];
  long lVar15;
  
  iVar1 = cinfo->Ss;
  iVar2 = cinfo->Se;
  if (iVar1 == 0) {
    bVar7 = iVar2 != 0;
  }
  else {
    bVar7 = cinfo->comps_in_scan != 1 || (0x3f < iVar2 || iVar2 < iVar1);
  }
  pjVar4 = cinfo->entropy;
  if (((0xd < cinfo->Al) || (cinfo->Ah != 0 && cinfo->Al != cinfo->Ah + -1)) || (bVar7)) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x10;
    (pjVar5->msg_parm).i[0] = iVar1;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->comps_in_scan < 1) {
    pcVar11 = decode_mcu_AC_first;
    if (iVar1 == 0) {
      pcVar11 = decode_mcu_DC_first;
    }
    pcVar13 = decode_mcu_AC_refine;
    if (iVar1 == 0) {
      pcVar13 = decode_mcu_DC_refine;
    }
    if (cinfo->Ah == 0) {
      pcVar13 = pcVar11;
    }
    pjVar4->decode_mcu = pcVar13;
  }
  else {
    lVar15 = 0;
    do {
      iVar2 = cinfo->cur_comp_info[lVar15]->component_index;
      paiVar6 = cinfo->coef_bits;
      paiVar14 = paiVar6 + iVar2;
      iVar12 = cinfo->num_components;
      if ((iVar1 != 0) && ((*paiVar14)[0] < 0)) {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x73;
        (pjVar5->msg_parm).i[0] = iVar2;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      iVar8 = cinfo->Ss;
      if (0 < iVar8) {
        iVar8 = 1;
      }
      lVar9 = (long)iVar8 + -1;
      do {
        iVar8 = 0;
        if (1 < cinfo->input_scan_number) {
          iVar8 = (*paiVar14)[lVar9 + 1];
        }
        paiVar6[iVar12 + iVar2][lVar9 + 1] = iVar8;
        uVar3 = cinfo->Se;
        uVar10 = 9;
        if (9 < (int)uVar3) {
          uVar10 = (ulong)uVar3;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)uVar10);
      iVar12 = cinfo->Ss;
      if (iVar12 <= (int)uVar3) {
        lVar9 = (long)iVar12 + -1;
        do {
          iVar8 = (*paiVar14)[lVar9 + 1];
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          if (cinfo->Ah != iVar8) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x73;
            (pjVar5->msg_parm).i[0] = iVar2;
            (cinfo->err->msg_parm).i[1] = iVar12;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar14)[lVar9 + 1] = cinfo->Al;
          lVar9 = lVar9 + 1;
          iVar12 = iVar12 + 1;
        } while (lVar9 < cinfo->Se);
      }
      lVar15 = lVar15 + 1;
      iVar2 = cinfo->comps_in_scan;
    } while (lVar15 < iVar2);
    pcVar11 = decode_mcu_AC_first;
    if (iVar1 == 0) {
      pcVar11 = decode_mcu_DC_first;
    }
    pcVar13 = decode_mcu_AC_refine;
    if (iVar1 == 0) {
      pcVar13 = decode_mcu_DC_refine;
    }
    if (cinfo->Ah == 0) {
      pcVar13 = pcVar11;
    }
    pjVar4->decode_mcu = pcVar13;
    if (0 < iVar2) {
      lVar15 = 0;
      do {
        if (iVar1 == 0) {
          if (cinfo->Ah == 0) {
            iVar2 = cinfo->cur_comp_info[lVar15]->dc_tbl_no;
            jpeg_make_d_derived_tbl
                      (cinfo,1,iVar2,
                       (d_derived_tbl **)(&pjVar4[2].insufficient_data + (long)iVar2 * 2));
          }
        }
        else {
          iVar2 = cinfo->cur_comp_info[lVar15]->ac_tbl_no;
          jpeg_make_d_derived_tbl
                    (cinfo,0,iVar2,
                     (d_derived_tbl **)(&pjVar4[2].insufficient_data + (long)iVar2 * 2));
          pjVar4[4].start_pass =
               *(_func_void_j_decompress_ptr **)(&pjVar4[2].insufficient_data + (long)iVar2 * 2);
        }
        *(undefined4 *)(&pjVar4[1].field_0x14 + lVar15 * 4) = 0;
        lVar15 = lVar15 + 1;
      } while (lVar15 < cinfo->comps_in_scan);
    }
  }
  *(undefined4 *)&pjVar4[1].decode_mcu = 0;
  pjVar4[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar4->insufficient_data = 0;
  pjVar4[1].insufficient_data = 0;
  *(uint *)((long)&pjVar4[2].decode_mcu + 4) = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass_phuff_decoder(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band, bad;
  int ci, coefi, tbl;
  d_derived_tbl **pdtbl;
  int *coef_bit_ptr, *prev_coef_bit_ptr;
  jpeg_component_info *compptr;

  is_DC_band = (cinfo->Ss == 0);

  /* Validate scan parameters */
  bad = FALSE;
  if (is_DC_band) {
    if (cinfo->Se != 0)
      bad = TRUE;
  } else {
    /* need not check Ss/Se < 0 since they came from unsigned bytes */
    if (cinfo->Ss > cinfo->Se || cinfo->Se >= DCTSIZE2)
      bad = TRUE;
    /* AC scans may have only one component */
    if (cinfo->comps_in_scan != 1)
      bad = TRUE;
  }
  if (cinfo->Ah != 0) {
    /* Successive approximation refinement scan: must have Al = Ah-1. */
    if (cinfo->Al != cinfo->Ah - 1)
      bad = TRUE;
  }
  if (cinfo->Al > 13)           /* need not check for < 0 */
    bad = TRUE;
  /* Arguably the maximum Al value should be less than 13 for 8-bit precision,
   * but the spec doesn't say so, and we try to be liberal about what we
   * accept.  Note: large Al values could result in out-of-range DC
   * coefficients during early scans, leading to bizarre displays due to
   * overflows in the IDCT math.  But we won't crash.
   */
  if (bad)
    ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
             cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
  /* Update progression status, and verify that scan order is legal.
   * Note that inter-scan inconsistencies are treated as warnings
   * not fatal errors ... not clear if this is right way to behave.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    int cindex = cinfo->cur_comp_info[ci]->component_index;
    coef_bit_ptr = &cinfo->coef_bits[cindex][0];
    prev_coef_bit_ptr = &cinfo->coef_bits[cindex + cinfo->num_components][0];
    if (!is_DC_band && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
      WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
    for (coefi = MIN(cinfo->Ss, 1); coefi <= MAX(cinfo->Se, 9); coefi++) {
      if (cinfo->input_scan_number > 1)
        prev_coef_bit_ptr[coefi] = coef_bit_ptr[coefi];
      else
        prev_coef_bit_ptr[coefi] = 0;
    }
    for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
      int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
      if (cinfo->Ah != expected)
        WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
      coef_bit_ptr[coefi] = cinfo->Al;
    }
  }

  /* Select MCU decoding routine */
  if (cinfo->Ah == 0) {
    if (is_DC_band)
      entropy->pub.decode_mcu = decode_mcu_DC_first;
    else
      entropy->pub.decode_mcu = decode_mcu_AC_first;
  } else {
    if (is_DC_band)
      entropy->pub.decode_mcu = decode_mcu_DC_refine;
    else
      entropy->pub.decode_mcu = decode_mcu_AC_refine;
  }

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* Make sure requested tables are present, and compute derived tables.
     * We may build same derived table more than once, but it's not expensive.
     */
    if (is_DC_band) {
      if (cinfo->Ah == 0) {     /* DC refinement needs no table */
        tbl = compptr->dc_tbl_no;
        pdtbl = (d_derived_tbl **)(entropy->derived_tbls) + tbl;
        jpeg_make_d_derived_tbl(cinfo, TRUE, tbl, pdtbl);
      }
    } else {
      tbl = compptr->ac_tbl_no;
      pdtbl = (d_derived_tbl **)(entropy->derived_tbls) + tbl;
      jpeg_make_d_derived_tbl(cinfo, FALSE, tbl, pdtbl);
      /* remember the single active table */
      entropy->ac_derived_tbl = entropy->derived_tbls[tbl];
    }
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize private state variables */
  entropy->saved.EOBRUN = 0;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}